

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int walIndexPageRealloc(Wal *pWal,int iPage,u32 **ppPage)

{
  u32 **ppuVar1;
  u32 *puVar2;
  u32 **apNew;
  sqlite3_int64 nByte;
  int rc;
  u32 **ppPage_local;
  int iPage_local;
  Wal *pWal_local;
  
  nByte._4_4_ = 0;
  if (pWal->nWiData <= iPage) {
    ppuVar1 = (u32 **)sqlite3_realloc64(pWal->apWiData,(long)(iPage + 1) << 3);
    if (ppuVar1 == (u32 **)0x0) {
      *ppPage = (u32 *)0x0;
      return 7;
    }
    memset(ppuVar1 + pWal->nWiData,0,(long)((iPage + 1) - pWal->nWiData) << 3);
    pWal->apWiData = ppuVar1;
    pWal->nWiData = iPage + 1;
  }
  if (pWal->exclusiveMode == '\x02') {
    puVar2 = (u32 *)sqlite3MallocZero(0x8000);
    pWal->apWiData[iPage] = puVar2;
    if (pWal->apWiData[iPage] == (u32 *)0x0) {
      nByte._4_4_ = 7;
    }
  }
  else {
    nByte._4_4_ = sqlite3OsShmMap(pWal->pDbFd,iPage,0x8000,(uint)pWal->writeLock,
                                  pWal->apWiData + iPage);
    if (((nByte._4_4_ & 0xff) == 8) && (pWal->readOnly = pWal->readOnly | 2, nByte._4_4_ == 8)) {
      nByte._4_4_ = 0;
    }
  }
  *ppPage = pWal->apWiData[iPage];
  return nByte._4_4_;
}

Assistant:

static SQLITE_NOINLINE int walIndexPageRealloc(
  Wal *pWal,               /* The WAL context */
  int iPage,               /* The page we seek */
  volatile u32 **ppPage    /* Write the page pointer here */
){
  int rc = SQLITE_OK;

  /* Enlarge the pWal->apWiData[] array if required */
  if( pWal->nWiData<=iPage ){
    sqlite3_int64 nByte = sizeof(u32*)*(iPage+1);
    volatile u32 **apNew;
    apNew = (volatile u32 **)sqlite3_realloc64((void *)pWal->apWiData, nByte);
    if( !apNew ){
      *ppPage = 0;
      return SQLITE_NOMEM_BKPT;
    }
    memset((void*)&apNew[pWal->nWiData], 0,
           sizeof(u32*)*(iPage+1-pWal->nWiData));
    pWal->apWiData = apNew;
    pWal->nWiData = iPage+1;
  }

  /* Request a pointer to the required page from the VFS */
  assert( pWal->apWiData[iPage]==0 );
  if( pWal->exclusiveMode==WAL_HEAPMEMORY_MODE ){
    pWal->apWiData[iPage] = (u32 volatile *)sqlite3MallocZero(WALINDEX_PGSZ);
    if( !pWal->apWiData[iPage] ) rc = SQLITE_NOMEM_BKPT;
  }else{
    rc = sqlite3OsShmMap(pWal->pDbFd, iPage, WALINDEX_PGSZ, 
        pWal->writeLock, (void volatile **)&pWal->apWiData[iPage]
    );
    assert( pWal->apWiData[iPage]!=0 || rc!=SQLITE_OK || pWal->writeLock==0 );
    testcase( pWal->apWiData[iPage]==0 && rc==SQLITE_OK );
    if( (rc&0xff)==SQLITE_READONLY ){
      pWal->readOnly |= WAL_SHM_RDONLY;
      if( rc==SQLITE_READONLY ){
        rc = SQLITE_OK;
      }
    }
  }

  *ppPage = pWal->apWiData[iPage];
  assert( iPage==0 || *ppPage || rc!=SQLITE_OK );
  return rc;
}